

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long lVar1;
  uint uVar2;
  u32 uVar3;
  int iVar4;
  JsonString *p_00;
  void *pvVar5;
  long in_RDX;
  int in_ESI;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  u32 j;
  int nPath;
  char *zPath;
  int i;
  int flags;
  JsonParse *p;
  JsonString jx;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar6;
  int in_stack_ffffffffffffff3c;
  JsonString *in_stack_ffffffffffffff40;
  int iVar7;
  undefined1 local_90 [12];
  u32 in_stack_ffffffffffffff7c;
  sqlite3_value *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  u32 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  u32 in_stack_ffffffffffffff9c;
  JsonString *in_stack_ffffffffffffffa0;
  u32 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  sqlite3_context *in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffc4;
  JsonParse *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_90,0xaa,0x88);
  if ((1 < in_ESI) &&
     (p_00 = (JsonString *)
             jsonParseFuncArg((sqlite3_context *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                              in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c),
     p_00 != (JsonString *)0x0)) {
    pvVar5 = sqlite3_user_data(in_RDI);
    uVar2 = (uint)pvVar5;
    jsonStringInit(in_stack_ffffffffffffff40,
                   (sqlite3_context *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
    ;
    if (2 < in_ESI) {
      jsonAppendChar(in_stack_ffffffffffffff40,(char)((uint)in_stack_ffffffffffffff3c >> 0x18));
    }
    for (iVar7 = 1; iVar7 < in_ESI; iVar7 = iVar7 + 1) {
      in_stack_ffffffffffffff40 = (JsonString *)sqlite3_value_text((sqlite3_value *)0x22fda5);
      uVar6 = 0xaaaaaaaa;
      if (in_stack_ffffffffffffff40 == (JsonString *)0x0) goto LAB_0023013f;
      in_stack_ffffffffffffff3c = sqlite3Strlen30(&DAT_aaaaaaaaaaaaaaaa);
      if (*(char *)&in_stack_ffffffffffffff40->pCtx == '$') {
        uVar3 = jsonLookupStep((JsonParse *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                               in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      }
      else {
        if ((uVar2 & 3) == 0) {
          jsonBadPathError((sqlite3_context *)CONCAT44(uVar2,iVar7),
                           (char *)in_stack_ffffffffffffff40);
          goto LAB_0023013f;
        }
        jsonStringInit(in_stack_ffffffffffffff40,
                       (sqlite3_context *)CONCAT44(in_stack_ffffffffffffff3c,uVar6));
        iVar4 = sqlite3_value_type(*(sqlite3_value **)(in_RDX + (long)iVar7 * 8));
        if (iVar4 == 1) {
          jsonAppendRawNZ(in_stack_ffffffffffffff40,
                          (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),0);
          if (*(char *)&in_stack_ffffffffffffff40->pCtx == '-') {
            jsonAppendRawNZ(in_stack_ffffffffffffff40,
                            (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),0);
          }
          jsonAppendRaw(in_stack_ffffffffffffff40,(char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),
                        0);
          jsonAppendRawNZ(in_stack_ffffffffffffff40,
                          (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),0);
        }
        else {
          iVar4 = jsonAllAlphanum((char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          if (iVar4 == 0) {
            if (((*(char *)&in_stack_ffffffffffffff40->pCtx == '[') &&
                (2 < in_stack_ffffffffffffff3c)) &&
               (in_stack_ffffffffffffff40->zSpace[(long)(in_stack_ffffffffffffff3c + -1) + -0x22] ==
                ']')) {
              jsonAppendRaw(in_stack_ffffffffffffff40,
                            (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),0);
            }
            else {
              jsonAppendRawNZ(in_stack_ffffffffffffff40,
                              (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),0);
              jsonAppendRaw(in_stack_ffffffffffffff40,
                            (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),0);
              jsonAppendRawNZ(in_stack_ffffffffffffff40,
                              (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),0);
            }
          }
          else {
            jsonAppendRawNZ(in_stack_ffffffffffffff40,
                            (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),0);
            jsonAppendRaw(in_stack_ffffffffffffff40,
                          (char *)CONCAT44(in_stack_ffffffffffffff3c,uVar6),0);
          }
        }
        jsonStringTerminate((JsonString *)0x22ff6d);
        uVar3 = jsonLookupStep((JsonParse *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                               in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        jsonStringReset((JsonString *)0x22ff8d);
      }
      if (uVar3 < *(uint *)&p_00->zBuf) {
        if (in_ESI == 2) {
          if ((uVar2 & 1) == 0) {
            jsonReturnFromBlob(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                               in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
            if (((uVar2 & 10) == 0) &&
               (10 < (*(byte *)((long)p_00->pCtx->argv + ((ulong)uVar3 - 0x30)) & 0xf))) {
              sqlite3_result_subtype(in_RDI,0x4a);
            }
          }
          else {
            jsonStringInit(in_stack_ffffffffffffff40,
                           (sqlite3_context *)CONCAT44(in_stack_ffffffffffffff3c,uVar3));
            jsonTranslateBlobToText
                      ((JsonParse *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
            jsonReturnString(p_00,(JsonParse *)CONCAT44(uVar2,iVar7),
                             (sqlite3_context *)in_stack_ffffffffffffff40);
            jsonStringReset((JsonString *)0x230009);
            sqlite3_result_subtype(in_RDI,0x4a);
          }
        }
        else {
          jsonAppendSeparator(in_stack_ffffffffffffff40);
          jsonTranslateBlobToText
                    ((JsonParse *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
        }
      }
      else {
        if (uVar3 != 0xfffffffe) {
          if (uVar3 == 0xffffffff) {
            sqlite3_result_error
                      ((sqlite3_context *)in_stack_ffffffffffffff40,
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,0xffffffff),0);
          }
          else {
            jsonBadPathError((sqlite3_context *)CONCAT44(uVar2,iVar7),
                             (char *)in_stack_ffffffffffffff40);
          }
          goto LAB_0023013f;
        }
        if (in_ESI == 2) goto LAB_0023013f;
        jsonAppendSeparator(in_stack_ffffffffffffff40);
        jsonAppendRawNZ(in_stack_ffffffffffffff40,(char *)CONCAT44(in_stack_ffffffffffffff3c,uVar3),
                        0);
      }
    }
    if (2 < in_ESI) {
      jsonAppendChar(in_stack_ffffffffffffff40,(char)((uint)in_stack_ffffffffffffff3c >> 0x18));
      jsonReturnString(p_00,(JsonParse *)CONCAT44(uVar2,iVar7),
                       (sqlite3_context *)in_stack_ffffffffffffff40);
      if ((uVar2 & 8) == 0) {
        sqlite3_result_subtype(in_RDI,0x4a);
      }
    }
LAB_0023013f:
    jsonStringReset((JsonString *)0x230149);
    jsonParseFree((JsonParse *)0x230153);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p = 0;      /* The parse */
  int flags;             /* Flags associated with the function */
  int i;                 /* Loop counter */
  JsonString jx;         /* String for array result */

  if( argc<2 ) return;
  p = jsonParseFuncArg(ctx, argv[0], 0);
  if( p==0 ) return;
  flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  jsonStringInit(&jx, ctx);
  if( argc>2 ){
    jsonAppendChar(&jx, '[');
  }
  for(i=1; i<argc; i++){
    /* With a single PATH argument */
    const char *zPath = (const char*)sqlite3_value_text(argv[i]);
    int nPath;
    u32 j;
    if( zPath==0 ) goto json_extract_error;
    nPath = sqlite3Strlen30(zPath);
    if( zPath[0]=='$' ){
      j = jsonLookupStep(p, 0, zPath+1, 0);
    }else if( (flags & JSON_ABPATH) ){
      /* The -> and ->> operators accept abbreviated PATH arguments.  This
      ** is mostly for compatibility with PostgreSQL, but also for
      ** convenience.
      **
      **     NUMBER   ==>  $[NUMBER]     // PG compatible
      **     LABEL    ==>  $.LABEL       // PG compatible
      **     [NUMBER] ==>  $[NUMBER]     // Not PG.  Purely for convenience
      **
      ** Updated 2024-05-27:  If the NUMBER is negative, then PG counts from
      ** the right of the array.  Hence for negative NUMBER:
      **
      **     NUMBER   ==>  $[#NUMBER]    // PG compatible
      */
      jsonStringInit(&jx, ctx);
      if( sqlite3_value_type(argv[i])==SQLITE_INTEGER ){
        jsonAppendRawNZ(&jx, "[", 1);
        if( zPath[0]=='-' ) jsonAppendRawNZ(&jx,"#",1);
        jsonAppendRaw(&jx, zPath, nPath);
        jsonAppendRawNZ(&jx, "]", 2);
      }else if( jsonAllAlphanum(zPath, nPath) ){
        jsonAppendRawNZ(&jx, ".", 1);
        jsonAppendRaw(&jx, zPath, nPath);
      }else if( zPath[0]=='[' && nPath>=3 && zPath[nPath-1]==']' ){
        jsonAppendRaw(&jx, zPath, nPath);
      }else{
        jsonAppendRawNZ(&jx, ".\"", 2);
        jsonAppendRaw(&jx, zPath, nPath);
        jsonAppendRawNZ(&jx, "\"", 1);
      }
      jsonStringTerminate(&jx);
      j = jsonLookupStep(p, 0, jx.zBuf, 0);
      jsonStringReset(&jx);
    }else{
      jsonBadPathError(ctx, zPath);
      goto json_extract_error;
    }
    if( j<p->nBlob ){
      if( argc==2 ){
        if( flags & JSON_JSON ){
          jsonStringInit(&jx, ctx);
          jsonTranslateBlobToText(p, j, &jx);
          jsonReturnString(&jx, 0, 0);
          jsonStringReset(&jx);
          assert( (flags & JSON_BLOB)==0 );
          sqlite3_result_subtype(ctx, JSON_SUBTYPE);
        }else{
          jsonReturnFromBlob(p, j, ctx, 0);
          if( (flags & (JSON_SQL|JSON_BLOB))==0
           && (p->aBlob[j]&0x0f)>=JSONB_ARRAY
          ){
            sqlite3_result_subtype(ctx, JSON_SUBTYPE);
          }
        }
      }else{
        jsonAppendSeparator(&jx);
        jsonTranslateBlobToText(p, j, &jx);
      }
    }else if( j==JSON_LOOKUP_NOTFOUND ){
      if( argc==2 ){
        goto json_extract_error;  /* Return NULL if not found */
      }else{
        jsonAppendSeparator(&jx);
        jsonAppendRawNZ(&jx, "null", 4);
      }
    }else if( j==JSON_LOOKUP_ERROR ){
      sqlite3_result_error(ctx, "malformed JSON", -1);
      goto json_extract_error;
    }else{
      jsonBadPathError(ctx, zPath);
      goto json_extract_error;
    }
  }
  if( argc>2 ){
    jsonAppendChar(&jx, ']');
    jsonReturnString(&jx, 0, 0);
    if( (flags & JSON_BLOB)==0 ){
      sqlite3_result_subtype(ctx, JSON_SUBTYPE);
    }
  }
json_extract_error:
  jsonStringReset(&jx);
  jsonParseFree(p);
  return;
}